

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

void lua_replace(lua_State *L,int idx)

{
  ulong uVar1;
  TValue *pTVar2;
  GCobj *o;
  global_State *g;
  
  if (idx == -0x2711) {
    uVar1 = (ulong)L->base[-1].u32.lo;
    if (*(char *)(uVar1 + 5) != '\b') {
      lj_err_msg(L,LJ_ERR_NOENV);
    }
    *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)(uVar1 + 8) =
         L->top[-1].field_2.field_0;
    if ((8 < *(int *)((long)L->top + -4) + 0xdU) ||
       (o = (GCobj *)(ulong)L->top[-1].u32.lo, ((o->gch).marked & 3) == 0)) goto LAB_0010f41b;
  }
  else {
    if (idx == -0x2712) {
      (L->env).gcptr32 = (uint32_t)L->top[-1].field_2.field_0;
      goto LAB_0010f41b;
    }
    pTVar2 = index2adr(L,idx);
    *pTVar2 = L->top[-1];
    if (((-0x2713 < idx) || (8 < *(int *)((long)L->top + -4) + 0xdU)) ||
       (o = (GCobj *)(ulong)L->top[-1].u32.lo, ((o->gch).marked & 3) == 0)) goto LAB_0010f41b;
    uVar1 = (ulong)L->base[-1].u32.lo;
  }
  if ((*(byte *)(uVar1 + 4) & 4) != 0) {
    g = (global_State *)(ulong)(L->glref).ptr32;
    if ((byte)((g->gc).state - 1) < 2) {
      gc_mark(g,o);
    }
    else {
      *(byte *)(uVar1 + 4) = (g->gc).currentwhite & 3 | *(byte *)(uVar1 + 4) & 0xf8;
    }
  }
LAB_0010f41b:
  L->top = L->top + -1;
  return;
}

Assistant:

LUA_API void lua_replace(lua_State *L, int idx)
{
  api_checknelems(L, 1);
  if (idx == LUA_GLOBALSINDEX) {
    api_check(L, tvistab(L->top-1));
    /* NOBARRIER: A thread (i.e. L) is never black. */
    setgcref(L->env, obj2gco(tabV(L->top-1)));
  } else if (idx == LUA_ENVIRONINDEX) {
    GCfunc *fn = curr_func(L);
    if (fn->c.gct != ~LJ_TFUNC)
      lj_err_msg(L, LJ_ERR_NOENV);
    api_check(L, tvistab(L->top-1));
    setgcref(fn->c.env, obj2gco(tabV(L->top-1)));
    lj_gc_barrier(L, fn, L->top-1);
  } else {
    TValue *o = index2adr(L, idx);
    api_checkvalidindex(L, o);
    copyTV(L, o, L->top-1);
    if (idx < LUA_GLOBALSINDEX)  /* Need a barrier for upvalues. */
      lj_gc_barrier(L, curr_func(L), L->top-1);
  }
  L->top--;
}